

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O0

void __thiscall CTxMemPoolEntry::UpdateModifiedFee(CTxMemPoolEntry *this,CAmount fee_diff)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = in_RDI;
  lVar2 = SaturatingAdd<long>(in_RDI,in_RSI);
  *(long *)(in_RDI + 0xd8) = lVar2;
  lVar2 = SaturatingAdd<long>(lVar3,in_RSI);
  *(long *)(in_RDI + 0xf0) = lVar2;
  lVar3 = SaturatingAdd<long>(lVar3,in_RSI);
  *(long *)(in_RDI + 0xa8) = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdateModifiedFee(CAmount fee_diff)
    {
        nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, fee_diff);
        nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, fee_diff);
        m_modified_fee = SaturatingAdd(m_modified_fee, fee_diff);
    }